

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O2

void Bdc_ManPrepare(Bdc_Man_t *p,Vec_Ptr_t *vDivs)

{
  uint uVar1;
  Bdc_Fun_t *pBVar2;
  uint *puVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  Bdc_TableClear(p);
  p->vMemory->nSize = 0;
  p->nNodes = 0;
  if (vDivs == (Vec_Ptr_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = vDivs->nSize;
  }
  p->nNodesNew = ~p->nVars - iVar5;
  pBVar2 = Bdc_FunNew(p);
  pBVar2->Type = 1;
  puVar3 = Vec_IntFetch(p->vMemory,p->nWords);
  pBVar2->puFunc = puVar3;
  uVar4 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
  if (p->nVars < 6) {
    uVar4 = 1;
  }
  for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    puVar3[uVar4 - 1] = 0xffffffff;
  }
  pBVar2->uSupp = 0;
  Bdc_TableAdd(p,pBVar2);
  for (iVar5 = 0; iVar5 < p->nVars; iVar5 = iVar5 + 1) {
    pBVar2 = Bdc_FunNew(p);
    pBVar2->Type = 2;
    puVar3 = (uint *)Vec_PtrEntry(p->vTruths,iVar5);
    pBVar2->puFunc = puVar3;
    pBVar2->uSupp = 1 << ((byte)iVar5 & 0x1f);
    Bdc_TableAdd(p,pBVar2);
  }
  if (vDivs != (Vec_Ptr_t *)0x0) {
    iVar5 = 0;
    do {
      if (vDivs->nSize <= iVar5) break;
      puVar3 = (uint *)Vec_PtrEntry(vDivs,iVar5);
      pBVar2 = Bdc_FunNew(p);
      pBVar2->Type = 2;
      pBVar2->puFunc = puVar3;
      uVar1 = Kit_TruthSupport(puVar3,p->nVars);
      pBVar2->uSupp = uVar1;
      Bdc_TableAdd(p,pBVar2);
      bVar6 = iVar5 != p->nDivsLimit;
      iVar5 = iVar5 + 1;
    } while (bVar6);
  }
  if (p->nNodesNew == 0) {
    return;
  }
  __assert_fail("p->nNodesNew == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcCore.c"
                ,0xb9,"void Bdc_ManPrepare(Bdc_Man_t *, Vec_Ptr_t *)");
}

Assistant:

void Bdc_ManPrepare( Bdc_Man_t * p, Vec_Ptr_t * vDivs )
{
    unsigned * puTruth;
    Bdc_Fun_t * pNode;
    int i;
    Bdc_TableClear( p );
    Vec_IntClear( p->vMemory );
    // add constant 1 and elementary vars
    p->nNodes = 0;
    p->nNodesNew = - 1 - p->nVars - (vDivs? Vec_PtrSize(vDivs) : 0);
    // add constant 1
    pNode = Bdc_FunNew( p );
    pNode->Type = BDC_TYPE_CONST1;
    pNode->puFunc = (unsigned *)Vec_IntFetch(p->vMemory, p->nWords); 
    Kit_TruthFill( pNode->puFunc, p->nVars );
    pNode->uSupp = 0;
    Bdc_TableAdd( p, pNode );
    // add variables
    for ( i = 0; i < p->nVars; i++ )
    {
        pNode = Bdc_FunNew( p );
        pNode->Type = BDC_TYPE_PI;
        pNode->puFunc = (unsigned *)Vec_PtrEntry( p->vTruths, i );
        pNode->uSupp = (1 << i);
        Bdc_TableAdd( p, pNode );
    }
    // add the divisors
    if ( vDivs )
    Vec_PtrForEachEntry( unsigned *, vDivs, puTruth, i )
    {
        pNode = Bdc_FunNew( p );
        pNode->Type = BDC_TYPE_PI;
        pNode->puFunc = puTruth;
        pNode->uSupp = Kit_TruthSupport( puTruth, p->nVars );
        Bdc_TableAdd( p, pNode );
        if ( i == p->nDivsLimit )
            break;
    }
    assert( p->nNodesNew == 0 );
}